

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestRunNode::~TestRunNode(TestRunNode *this)

{
  (this->super_TestRunStats)._vptr_TestRunStats = (_func_int **)&PTR__TestRunNode_0016d1a0;
  std::vector<Catch::TestGroupNode,_std::allocator<Catch::TestGroupNode>_>::~vector(&this->groups);
  TestRunStats::~TestRunStats(&this->super_TestRunStats);
  return;
}

Assistant:

TestRunNode::~TestRunNode() {}